

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

float __thiscall pbrt::SampledGrid<float>::MaximumValue(SampledGrid<float> *this,Bounds3f *bounds)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined4 in_register_00000014;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  Point3i local_98;
  undefined1 local_88 [16];
  int local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ulong local_40;
  ulong local_38;
  undefined1 extraout_var_00 [60];
  
  uVar1 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.x;
  uVar4 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  auVar18._0_4_ = (float)this->nz;
  auVar18._4_12_ = in_ZMM0._4_12_;
  uVar10 = this->nz - 1;
  auVar16 = vfmadd132ss_fma(ZEXT416((uint)(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z),
                            SUB6416(ZEXT464(0xbf000000),0),auVar18);
  auVar18 = vfmadd132ss_fma(auVar18,SUB6416(ZEXT464(0xbf000000),0),
                            ZEXT416((uint)(bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z));
  uStack_70 = 0;
  auVar16 = vroundss_avx(auVar16,auVar16,9);
  auVar18 = vroundss_avx(auVar18,auVar18,9);
  uVar2 = this->nx;
  uVar5 = this->ny;
  local_68._4_4_ = uVar5;
  local_68._0_4_ = uVar2;
  local_68._8_8_ = 0;
  uVar13 = ~((int)auVar16._0_4_ >> 0x1f) & (int)auVar16._0_4_;
  local_58 = vcvtdq2ps_avx(local_68);
  uVar3 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  auVar17._4_4_ = uVar6;
  auVar17._0_4_ = uVar3;
  auVar17._8_8_ = 0;
  auVar16._8_4_ = 0xbf000000;
  auVar16._0_8_ = 0xbf000000bf000000;
  auVar16._12_4_ = 0xbf000000;
  auVar16 = vfmadd213ps_avx512vl(auVar17,local_58,auVar16);
  uVar9 = (int)auVar18._0_4_ + 1;
  auVar16 = vroundps_avx(auVar16,9);
  auVar20._0_4_ = (int)auVar16._0_4_;
  auVar20._4_4_ = (int)auVar16._4_4_;
  auVar20._8_4_ = (int)auVar16._8_4_;
  auVar20._12_4_ = (int)auVar16._12_4_;
  local_88 = vpmaxsd_avx(auVar20,ZEXT816(0) << 0x20);
  local_40 = (ulong)local_88._4_4_;
  local_38 = CONCAT44(in_register_00000014,local_88._0_4_);
  local_98.super_Tuple3<pbrt::Point3,_int>._0_8_ =
       CONCAT44(in_register_00000014,local_88._0_4_) + (local_40 << 0x20);
  if ((int)uVar9 <= (int)uVar10) {
    uVar10 = uVar9;
  }
  local_98.super_Tuple3<pbrt::Point3,_int>.z = uVar13;
  local_78 = uVar1;
  uStack_74 = uVar4;
  auVar22._0_4_ = Lookup(this,&local_98);
  auVar22._4_60_ = extraout_var;
  auVar16 = auVar22._0_16_;
  auVar22 = ZEXT1664(auVar16);
  if ((int)uVar13 <= (int)uVar10) {
    auVar8._4_4_ = uStack_74;
    auVar8._0_4_ = local_78;
    auVar8._8_8_ = uStack_70;
    auVar18 = vpcmpeqd_avx(auVar16,auVar16);
    auVar16 = vpaddd_avx(auVar18,local_68);
    auVar7._8_4_ = 0xbf000000;
    auVar7._0_8_ = 0xbf000000bf000000;
    auVar7._12_4_ = 0xbf000000;
    auVar17 = vfmadd213ps_avx512vl(local_58,auVar8,auVar7);
    auVar17 = vroundps_avx(auVar17,9);
    auVar21._0_4_ = (int)auVar17._0_4_;
    auVar21._4_4_ = (int)auVar17._4_4_;
    auVar21._8_4_ = (int)auVar17._8_4_;
    auVar21._12_4_ = (int)auVar17._12_4_;
    auVar18 = vpsubd_avx(auVar21,auVar18);
    auVar18 = vpminsd_avx(auVar16,auVar18);
    uVar12 = vpcmpd_avx512vl(auVar18,local_88,1);
    local_78 = auVar18._4_4_;
    local_68._0_4_ = (int)(uVar12 & 0xf);
    local_88._0_4_ = (int)((uVar12 & 0xf) >> 1);
    do {
      uVar12 = local_40;
      if ((local_88 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        do {
          uVar14 = local_38 & 0xffffffff;
          iVar11 = (int)uVar12;
          if ((local_68 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            do {
              local_98.super_Tuple3<pbrt::Point3,_int>.y = iVar11;
              local_98.super_Tuple3<pbrt::Point3,_int>.x = (int)uVar14;
              local_58._0_4_ = auVar22._0_4_;
              local_98.super_Tuple3<pbrt::Point3,_int>.z = uVar13;
              auVar19._0_4_ = Lookup(this,&local_98);
              auVar19._4_60_ = extraout_var_00;
              uVar9 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar9;
              auVar16 = vmaxss_avx(auVar19._0_16_,ZEXT416((uint)local_58._0_4_));
              auVar22 = ZEXT1664(auVar16);
            } while (auVar18._0_4_ + 1U != uVar9);
          }
          uVar12 = (ulong)(iVar11 + 1);
        } while (iVar11 != local_78);
      }
      auVar16 = auVar22._0_16_;
      bVar15 = uVar13 != uVar10;
      uVar13 = uVar13 + 1;
    } while (bVar15);
  }
  return auVar16._0_4_;
}

Assistant:

T MaximumValue(const Bounds3f &bounds) const {
        Point3f ps[2] = {Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                                 bounds.pMin.z * nz - .5f),
                         Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                                 bounds.pMax.z * nz - .5f)};
        Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                         Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                             Point3i(nx - 1, ny - 1, nz - 1))};

        T maxValue = Lookup(Point3i(pi[0]));
        for (int z = pi[0].z; z <= pi[1].z; ++z)
            for (int y = pi[0].y; y <= pi[1].y; ++y)
                for (int x = pi[0].x; x <= pi[1].x; ++x) {
                    using std::max;
                    maxValue = max(maxValue, Lookup(Point3i(x, y, z)));
                }

        return maxValue;
    }